

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool __thiscall
snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>::TryFastAppend
          (SnappyScatteredWriter<snappy::SnappySinkAllocator> *this,char *ip,size_t available,
          size_t length)

{
  char *dst;
  int space_left;
  char *op;
  size_t length_local;
  size_t available_local;
  char *ip_local;
  SnappyScatteredWriter<snappy::SnappySinkAllocator> *this_local;
  
  dst = this->op_ptr_;
  if (((length < 0x11) && (0x14 < available)) && (0xf < (int)this->op_limit_ - (int)dst)) {
    anon_unknown_48::UnalignedCopy128(ip,dst);
    this->op_ptr_ = dst + length;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool TryFastAppend(const char* ip, size_t available, size_t length) {
    char* op = op_ptr_;
    const int space_left = op_limit_ - op;
    if (length <= 16 && available >= 16 + kMaximumTagLength &&
        space_left >= 16) {
      // Fast path, used for the majority (about 95%) of invocations.
      UnalignedCopy128(ip, op);
      op_ptr_ = op + length;
      return true;
    } else {
      return false;
    }
  }